

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int inflateStateCheck(zng_stream *strm)

{
  internal_state *piVar1;
  
  if ((((strm != (zng_stream *)0x0) && (strm->zalloc != (alloc_func)0x0)) &&
      (strm->zfree != (free_func)0x0)) &&
     (((piVar1 = strm->state, piVar1 != (internal_state *)0x0 &&
       (piVar1[1].bl_desc.stat_desc != (static_tree_desc *)0x0)) && (piVar1->strm == strm)))) {
    return (int)(*(int *)&piVar1->pending_buf - 0x3f53U < 0xffffffe1);
  }
  return 1;
}

Assistant:

static int inflateStateCheck(PREFIX3(stream) *strm) {
    struct inflate_state *state;
    if (strm == NULL || strm->zalloc == NULL || strm->zfree == NULL)
        return 1;
    state = (struct inflate_state *)strm->state;
    if (state == NULL || state->alloc_bufs == NULL || state->strm != strm || state->mode < HEAD || state->mode > SYNC)
        return 1;
    return 0;
}